

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseVarList(WastParser *this,VarVector *out_var_list)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Var local_b0;
  undefined1 local_68 [8];
  Var var;
  VarVector *out_var_list_local;
  WastParser *this_local;
  
  var.field_2._24_8_ = out_var_list;
  Var::Var((Var *)local_68);
  while( true ) {
    Var::Var(&local_b0);
    bVar1 = ParseVarOpt(this,(Var *)local_68,&local_b0);
    Var::~Var(&local_b0);
    if (!bVar1) break;
    std::vector<wabt::Var,std::allocator<wabt::Var>>::emplace_back<wabt::Var&>
              ((vector<wabt::Var,std::allocator<wabt::Var>> *)var.field_2._24_8_,(Var *)local_68);
  }
  bVar1 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::empty
                    ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)var.field_2._24_8_);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"a var",&local_f9);
    local_d8 = &local_f8;
    local_d0 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_fa);
    __l._M_len = local_d0;
    __l._M_array = local_d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c8,__l,&local_fa);
    this_local._4_4_ = ErrorExpected(this,&local_c8,"12 or $foo");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_fa);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
    do {
      local_118 = local_118 + -1;
      std::__cxx11::string::~string((string *)local_118);
    } while (local_118 != &local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseVarList(VarVector* out_var_list) {
  WABT_TRACE(ParseVarList);
  Var var;
  while (ParseVarOpt(&var)) {
    out_var_list->emplace_back(var);
  }
  if (out_var_list->empty()) {
    return ErrorExpected({"a var"}, "12 or $foo");
  } else {
    return Result::Ok;
  }
}